

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

void fs_event_cb_dir_multi_file(uv_fs_event_t *handle,char *filename,int events,int status)

{
  int iVar1;
  undefined8 uVar2;
  int iVar3;
  int extraout_EDX;
  uint uVar4;
  char *pcVar5;
  long *plVar6;
  uv_fs_event_t *puVar7;
  code **ppcVar8;
  int64_t eval_b;
  int64_t eval_a;
  code *apcStack_248 [2];
  char acStack_238 [8];
  uv_fs_event_t auStack_230 [4];
  undefined8 uStack_68;
  long lStack_50;
  char *pcStack_48;
  
  uVar4 = fs_event_cb_called + 1;
  pcVar5 = (char *)(ulong)uVar4;
  fs_event_cb_called = uVar4;
  if (handle == &fs_event) {
    if (status != 0) goto LAB_00187c0d;
    if (1 < events - 1U) goto LAB_00187c1a;
    iVar1 = strncmp(filename,"fsevent-",8);
    if (iVar1 == 0) {
      if (fs_event_removed + fs_event_created == 0x10) {
        iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        if (iVar1 == 0) {
          return;
        }
        fs_event_cb_dir_multi_file_cold_5();
      }
      if (uVar4 != 0x20) {
        return;
      }
      uv_close(&timer,close_cb);
      uv_close(&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_multi_file_cold_1();
LAB_00187c0d:
    fs_event_cb_dir_multi_file_cold_2();
LAB_00187c1a:
    fs_event_cb_dir_multi_file_cold_3();
  }
  fs_event_cb_dir_multi_file_cold_4();
  if (fs_event_created < 0x10) {
    pcVar5 = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_48 = pcVar5;
  uVar2 = uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(uVar2,&fs_event);
  lStack_50 = (long)iVar1;
  if (lStack_50 == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    lStack_50 = (long)iVar1;
    if (lStack_50 != 0) goto LAB_00187efc;
    iVar1 = uv_timer_init(uVar2,&timer);
    lStack_50 = (long)iVar1;
    if (lStack_50 != 0) goto LAB_00187f09;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    lStack_50 = (long)iVar1;
    if (lStack_50 != 0) goto LAB_00187f16;
    uv_run(uVar2,0);
    lStack_50 = 1;
    if (fs_event_cb_called != 1) goto LAB_00187f23;
    lStack_50 = 2;
    if (timer_cb_called != 2) goto LAB_00187f30;
    lStack_50 = 2;
    if (close_cb_called != 2) goto LAB_00187f3d;
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    lStack_50 = 0;
    iVar1 = uv_loop_close(uVar2);
    if (lStack_50 == iVar1) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_watch_file_cold_1();
LAB_00187efc:
    run_test_fs_event_watch_file_cold_2();
LAB_00187f09:
    run_test_fs_event_watch_file_cold_3();
LAB_00187f16:
    run_test_fs_event_watch_file_cold_4();
LAB_00187f23:
    run_test_fs_event_watch_file_cold_5();
LAB_00187f30:
    run_test_fs_event_watch_file_cold_6();
LAB_00187f3d:
    run_test_fs_event_watch_file_cold_7();
  }
  plVar6 = &lStack_50;
  run_test_fs_event_watch_file_cold_8();
  iVar3 = 0x41;
  apcStack_248[0] = (code *)0x187f7d;
  uStack_68 = uVar2;
  iVar1 = uv_fs_open(0,&auStack_230[0].loop,plVar6,0x41,0x180,0);
  auStack_230[0].data = (void *)(long)iVar1;
  acStack_238[0] = '\0';
  acStack_238[1] = '\0';
  acStack_238[2] = '\0';
  acStack_238[3] = '\0';
  acStack_238[4] = '\0';
  acStack_238[5] = '\0';
  acStack_238[6] = '\0';
  acStack_238[7] = '\0';
  if (auStack_230[0].data == (void *)0x0) {
    apcStack_248[0] = (code *)0x187fa9;
    uv_fs_req_cleanup(&auStack_230[0].loop);
    iVar3 = 0;
    apcStack_248[0] = (code *)0x187fb7;
    iVar1 = uv_fs_close(0,&auStack_230[0].loop,auStack_230[0].wd);
    auStack_230[0].data = (void *)(long)iVar1;
    acStack_238[0] = '\0';
    acStack_238[1] = '\0';
    acStack_238[2] = '\0';
    acStack_238[3] = '\0';
    acStack_238[4] = '\0';
    acStack_238[5] = '\0';
    acStack_238[6] = '\0';
    acStack_238[7] = '\0';
    if (auStack_230[0].data == (void *)0x0) {
      apcStack_248[0] = (code *)0x187fdd;
      uv_fs_req_cleanup(&auStack_230[0].loop);
      return;
    }
  }
  else {
    apcStack_248[0] = (code *)0x187ff6;
    create_file_cold_1();
  }
  puVar7 = auStack_230;
  pcVar5 = acStack_238;
  apcStack_248[0] = fs_event_cb_file;
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar7 == &fs_event) {
    apcStack_248[0] = (code *)(long)iVar3;
    if (apcStack_248[0] != (code *)0x0) goto LAB_001880d3;
    apcStack_248[0] = (code *)(long)extraout_EDX;
    if (apcStack_248[0] != (code *)0x2) goto LAB_001880e2;
    iVar1 = strcmp(pcVar5,"file2");
    apcStack_248[0] = (code *)(long)iVar1;
    if (apcStack_248[0] == (code *)0x0) {
      iVar1 = uv_fs_event_stop(&fs_event);
      apcStack_248[0] = (code *)(long)iVar1;
      if (apcStack_248[0] == (code *)0x0) {
        uv_close(&fs_event,close_cb);
        return;
      }
      goto LAB_00188100;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_001880d3:
    fs_event_cb_file_cold_2();
LAB_001880e2:
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00188100:
  ppcVar8 = apcStack_248;
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close(ppcVar8,close_cb);
  return;
}

Assistant:

static void fs_event_cb_dir_multi_file(uv_fs_event_t* handle,
                                       const char* filename,
                                       int events,
                                       int status) {
  fs_event_cb_called++;
  ASSERT_PTR_EQ(handle, &fs_event);
  ASSERT_OK(status);
  ASSERT(events == UV_CHANGE || events == UV_RENAME);
  #if defined(__APPLE__) || defined(_WIN32) || defined(__linux__)
  ASSERT_OK(strncmp(filename, file_prefix, sizeof(file_prefix) - 1));
  #else
  ASSERT_NE(filename == NULL ||
            strncmp(filename, file_prefix, sizeof(file_prefix) - 1) == 0, 0);
  #endif

  if (fs_event_created + fs_event_removed == fs_event_file_count) {
    /* Once we've processed all create events, delete all files */
    ASSERT_OK(uv_timer_start(&timer, fs_event_unlink_files, 1, 0));
  } else if (fs_event_cb_called == 2 * fs_event_file_count) {
    /* Once we've processed all create and delete events, stop watching */
    uv_close((uv_handle_t*) &timer, close_cb);
    uv_close((uv_handle_t*) handle, close_cb);
  }
}